

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.cpp
# Opt level: O3

NameSingletonPair * __thiscall
List<NameSingletonPair>::Get(List<NameSingletonPair> *this,long index)

{
  out_of_range *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (*(long *)(this + 0x10) <= *(long *)(this + 8)) {
    return (NameSingletonPair *)(index * 0x10 + *(long *)this);
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Index out of range in List::Get","");
  std::out_of_range::out_of_range(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

Item& List<Item>::Get(long index) const {
    if (_count <= _size) {
      return _items[index];
    } else {
      throw std::out_of_range("Index out of range in List::Get");
    }
}